

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ChainPromiseNode::ChainPromiseNode
          (ChainPromiseNode *this,OwnPromiseNode *innerParam,SourceLocation location)

{
  PromiseNode *pPVar1;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_00597208;
  Event::Event(&this->super_Event,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_00596e68;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_00596eb0;
  this->state = STEP1;
  (this->inner).ptr = innerParam->ptr;
  innerParam->ptr = (PromiseNode *)0x0;
  this->onReadyEvent = (Event *)0x0;
  this->selfPtr = (OwnPromiseNode *)0x0;
  pPVar1 = (this->inner).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar1,&this->inner);
  pPVar1 = (this->inner).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,&this->super_Event);
  return;
}

Assistant:

ChainPromiseNode::ChainPromiseNode(OwnPromiseNode innerParam, SourceLocation location)
    : Event(location), state(STEP1), inner(kj::mv(innerParam)) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}